

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

Text __thiscall loguru::ec_to_text(loguru *this,EcHandle ec_handle)

{
  size_t sVar1;
  undefined1 *puVar2;
  Text parent_ec;
  char *local_20;
  
  get_error_context_for((loguru *)&local_20,ec_handle);
  sVar1 = strlen(local_20);
  puVar2 = (undefined1 *)malloc(sVar1 + 2);
  *puVar2 = 10;
  strcpy(puVar2 + 1,local_20);
  *(undefined1 **)this = puVar2;
  free(local_20);
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(EcHandle ec_handle)
	{
		Text parent_ec = get_error_context_for(ec_handle);
		size_t buffer_size = strlen(parent_ec.c_str()) + 2;
		char* with_newline = reinterpret_cast<char*>(malloc(buffer_size));
		with_newline[0] = '\n';
	#ifdef _WIN32
		strncpy_s(with_newline + 1, buffer_size, parent_ec.c_str(), buffer_size - 2);
	#else
		strcpy(with_newline + 1, parent_ec.c_str());
	#endif
		return Text(with_newline);
	}